

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_short(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data actValue_01;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  byte bVar1;
  bool bVar2;
  XMLCh *pXVar3;
  char *pcVar4;
  XSValue *pXVar5;
  char *pcVar6;
  char *pcVar7;
  wchar16 *pwVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  StrX local_7b8;
  StrX local_7a8;
  char *local_798;
  char *actRetCanRep_inchar_5;
  wchar16 *local_780;
  XMLCh *actRetCanRep_9;
  undefined1 local_770 [4];
  Status myStatus_23;
  StrX local_760;
  char *local_750;
  char *actRetCanRep_inchar_4;
  wchar16 *local_738;
  XMLCh *actRetCanRep_8;
  undefined1 local_728 [4];
  Status myStatus_22;
  StrX local_718;
  StrX local_708;
  long local_6f8;
  XMLCh *actRetCanRep_7;
  undefined1 local_6e8 [4];
  Status myStatus_21;
  StrX local_6d8;
  StrX local_6c8;
  long local_6b8;
  XMLCh *actRetCanRep_6;
  undefined1 local_6a8 [4];
  Status myStatus_20;
  StrX local_698;
  StrX local_688;
  long local_678;
  XMLCh *actRetCanRep_5;
  undefined1 local_668 [4];
  Status myStatus_19;
  StrX local_658;
  StrX local_648;
  long local_638;
  XMLCh *actRetCanRep_4;
  undefined1 local_628 [4];
  Status myStatus_18;
  StrX local_618;
  char *local_608;
  char *actRetCanRep_inchar_3;
  wchar16 *local_5f0;
  XMLCh *actRetCanRep_3;
  undefined1 local_5e0 [4];
  Status myStatus_17;
  StrX local_5d0;
  char *local_5c0;
  char *actRetCanRep_inchar_2;
  wchar16 *local_5a8;
  XMLCh *actRetCanRep_2;
  undefined1 local_598 [4];
  Status myStatus_16;
  StrX local_588;
  char *local_578;
  char *actRetCanRep_inchar_1;
  wchar16 *local_560;
  XMLCh *actRetCanRep_1;
  undefined1 local_550 [4];
  Status myStatus_15;
  StrX local_540;
  char *local_530;
  char *actRetCanRep_inchar;
  wchar16 *local_518;
  XMLCh *actRetCanRep;
  Status myStatus_14;
  int j;
  StrX local_4f8;
  StrX local_4e8;
  XSValue *local_4d8;
  XSValue *actRetValue_6;
  undefined1 local_4c8 [4];
  Status myStatus_13;
  StrX local_4b8;
  StrX local_4a8;
  XSValue *local_498;
  XSValue *actRetValue_5;
  undefined1 local_488 [4];
  Status myStatus_12;
  StrX local_478;
  StrX local_468;
  XSValue *local_458;
  XSValue *actRetValue_4;
  undefined1 local_448 [4];
  Status myStatus_11;
  StrX local_438;
  StrX local_428;
  XSValue *local_418;
  XSValue *actRetValue_3;
  undefined1 local_408 [4];
  Status myStatus_10;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  StrX local_3a8;
  XSValue *local_398;
  XSValue *actRetValue_2;
  undefined1 local_388 [4];
  Status myStatus_9;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  StrX local_328;
  XSValue *local_318;
  XSValue *actRetValue_1;
  undefined1 local_308 [4];
  Status myStatus_8;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  StrX local_2a8;
  XSValue *local_298;
  XSValue *actRetValue;
  Status myStatus_7;
  int i;
  StrX local_278;
  StrX local_268;
  byte local_255;
  Status local_254;
  undefined1 local_250 [3];
  bool actRetValid_6;
  Status myStatus_6;
  StrX local_240;
  StrX local_230;
  byte local_21d;
  Status local_21c;
  undefined1 local_218 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_208;
  StrX local_1f8;
  byte local_1e5;
  Status local_1e4;
  undefined1 local_1e0 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_1d0;
  StrX local_1c0;
  byte local_1ad;
  Status local_1ac;
  undefined1 local_1a8 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_198;
  byte local_185;
  Status local_184;
  undefined1 local_180 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_170;
  byte local_15d;
  Status local_15c;
  undefined1 local_158 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_138;
  byte local_125;
  Status local_124;
  char acStack_120 [3];
  bool actRetValid;
  Status myStatus;
  char data_canrep_2 [6];
  char data_rawstr_2 [9];
  char data_canrep_1 [6];
  char data_rawstr_1 [14];
  char lex_iv_2 [8];
  char lex_iv_1 [9];
  char lex_v_ran_iv_2_canrep [7];
  char lex_v_ran_iv_1_canrep [6];
  char lex_v_ran_v_2_canrep [7];
  char lex_v_ran_v_1_canrep [6];
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  XSValue_Data act_v_ran_v_0;
  char lex_v_ran_iv_2 [7];
  char lex_v_ran_iv_1 [7];
  char lex_v_ran_v_2 [7];
  char lex_v_ran_v_1 [7];
  char lex_v_ran_v_0 [14];
  bool toValidate;
  DataType dt;
  
  lex_v_ran_v_1[0] = ' ';
  lex_v_ran_v_1[1] = ' ';
  lex_v_ran_v_1[2] = ' ';
  lex_v_ran_v_1[3] = ' ';
  lex_v_ran_v_1[4] = '1';
  lex_v_ran_v_1[5] = '2';
  stack0xffffffffffffffe6 = 0x3433;
  builtin_strncpy(lex_v_ran_v_2,"+32767",7);
  builtin_strncpy(lex_v_ran_iv_1,"-32768",7);
  builtin_strncpy(lex_v_ran_iv_2,"+32768",7);
  act_v_ran_v_0.fValue._28_3_ = 0x3936;
  act_v_ran_v_0.fValue._24_4_ = 0x3732332d;
  act_v_ran_v_0.f_datatype._0_2_ = 0x4d2;
  act_v_ran_v_1.f_datatype._0_2_ = 0x7fff;
  act_v_ran_v_2.f_datatype._0_2_ = 0x8000;
  builtin_strncpy(lex_v_ran_v_2_canrep,"32767",6);
  stack0xffffffffffffff3c = 0x3836;
  lex_v_ran_iv_1_canrep[0] = '-';
  lex_v_ran_iv_1_canrep[1] = '3';
  lex_v_ran_iv_1_canrep[2] = '2';
  lex_v_ran_iv_1_canrep[3] = '7';
  builtin_strncpy(lex_v_ran_iv_2_canrep,"32768",6);
  stack0xffffffffffffff28 = 0x3732332d;
  builtin_strncpy(lex_iv_2,"1234.456",8);
  lex_iv_1[0] = '\0';
  stack0xffffffffffffff10 = 0x36356234333231;
  data_rawstr_1[0] = '5';
  data_rawstr_1[1] = ' ';
  data_rawstr_1[2] = ' ';
  data_rawstr_1[3] = ' ';
  data_rawstr_1[4] = '\n';
  data_rawstr_1[5] = '\0';
  builtin_strncpy(data_canrep_1,"   +12",6);
  stack0xfffffffffffffef8 = 0x34333231;
  _data_canrep_2 = 0x3534333231303030;
  data_rawstr_2[0] = '\0';
  myStatus._0_2_ = 0x35;
  _acStack_120 = 0x34333231;
  local_124 = st_Init;
  StrX::StrX(&local_138,lex_v_ran_v_1);
  pXVar3 = StrX::unicodeForm(&local_138);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_short,&local_124,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_138);
  local_125 = bVar1 & 1;
  if (local_125 != 1) {
    pXVar3 = getDataTypeString(dt_short);
    StrX::StrX((StrX *)local_158,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_158);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x822,lex_v_ran_v_1,pcVar4,1);
    StrX::~StrX((StrX *)local_158);
    errSeen = true;
  }
  local_15c = st_Init;
  StrX::StrX(&local_170,lex_v_ran_v_2);
  pXVar3 = StrX::unicodeForm(&local_170);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_short,&local_15c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_170);
  local_15d = bVar1 & 1;
  if (local_15d != 1) {
    pXVar3 = getDataTypeString(dt_short);
    StrX::StrX((StrX *)local_180,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_180);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x823,lex_v_ran_v_2,pcVar4,1);
    StrX::~StrX((StrX *)local_180);
    errSeen = true;
  }
  local_184 = st_Init;
  StrX::StrX(&local_198,lex_v_ran_iv_1);
  pXVar3 = StrX::unicodeForm(&local_198);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_short,&local_184,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_198);
  local_185 = bVar1 & 1;
  if (local_185 != 1) {
    pXVar3 = getDataTypeString(dt_short);
    StrX::StrX((StrX *)local_1a8,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_1a8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x824,lex_v_ran_iv_1,pcVar4,1);
    StrX::~StrX((StrX *)local_1a8);
    errSeen = true;
  }
  local_1ac = st_Init;
  StrX::StrX(&local_1c0,lex_v_ran_iv_2);
  pXVar3 = StrX::unicodeForm(&local_1c0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_short,&local_1ac,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1c0);
  local_1ad = bVar1 & 1;
  if (local_1ad == 0) {
    if (local_1ac != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX((StrX *)local_1e0,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_1e0);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_1ac);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x827,lex_v_ran_iv_2,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_1e0);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_short);
    StrX::StrX(&local_1d0,pXVar3);
    pcVar4 = StrX::localForm(&local_1d0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x827,lex_v_ran_iv_2,pcVar4,0);
    StrX::~StrX(&local_1d0);
    errSeen = true;
  }
  local_1e4 = st_Init;
  StrX::StrX(&local_1f8,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_1f8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_short,&local_1e4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1f8);
  local_1e5 = bVar1 & 1;
  if (local_1e5 == 0) {
    if (local_1e4 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX((StrX *)local_218,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_218);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_1e4);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x828,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_218);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_short);
    StrX::StrX(&local_208,pXVar3);
    pcVar4 = StrX::localForm(&local_208);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x828,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,0);
    StrX::~StrX(&local_208);
    errSeen = true;
  }
  local_21c = st_Init;
  StrX::StrX(&local_230,lex_iv_2);
  pXVar3 = StrX::unicodeForm(&local_230);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_short,&local_21c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_230);
  local_21d = bVar1 & 1;
  if (local_21d == 0) {
    if (local_21c != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX((StrX *)local_250,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_250);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_21c);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x82b,lex_iv_2,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_250);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_short);
    StrX::StrX(&local_240,pXVar3);
    pcVar4 = StrX::localForm(&local_240);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x82b,lex_iv_2,pcVar4,0);
    StrX::~StrX(&local_240);
    errSeen = true;
  }
  local_254 = st_Init;
  StrX::StrX(&local_268,data_rawstr_1 + 8);
  pXVar3 = StrX::unicodeForm(&local_268);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_short,&local_254,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_268);
  local_255 = bVar1 & 1;
  if (local_255 == 0) {
    if (local_254 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX((StrX *)&myStatus_7,pXVar3);
      pcVar4 = StrX::localForm((StrX *)&myStatus_7);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_254);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x82c,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)&myStatus_7);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_short);
    StrX::StrX(&local_278,pXVar3);
    pcVar4 = StrX::localForm(&local_278);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x82c,data_rawstr_1 + 8,pcVar4,0);
    StrX::~StrX(&local_278);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_2a8,lex_v_ran_v_1);
    pXVar3 = StrX::unicodeForm(&local_2a8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_short,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_2a8);
    local_298 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX((StrX *)local_308,pXVar3);
      StrX::localForm((StrX *)local_308);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x849,lex_v_ran_v_1);
      StrX::~StrX((StrX *)local_308);
      errSeen = true;
    }
    else {
      memcpy(&local_2d0,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_1.fValue + 0x18);
      memcpy(&local_2f8,pvVar10,0x28);
      actValue.fValue.f_long = uStack_2c8;
      actValue._0_8_ = local_2d0;
      actValue.fValue._8_8_ = local_2c0;
      actValue.fValue._16_8_ = uStack_2b8;
      actValue.fValue.f_datetime.f_milisec = (double)local_2b0;
      expValue.fValue.f_long = uStack_2f0;
      expValue._0_8_ = local_2f8;
      expValue.fValue._8_8_ = local_2e8;
      expValue.fValue._16_8_ = uStack_2e0;
      expValue.fValue.f_datetime.f_milisec = (double)local_2d8;
      bVar2 = compareActualValue(dt_short,actValue,expValue);
      pXVar5 = local_298;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_298 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_298);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_328,lex_v_ran_v_2);
    pXVar3 = StrX::unicodeForm(&local_328);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_short,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_328);
    local_318 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX((StrX *)local_388,pXVar3);
      StrX::localForm((StrX *)local_388);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x84b,lex_v_ran_v_2);
      StrX::~StrX((StrX *)local_388);
      errSeen = true;
    }
    else {
      memcpy(&local_350,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_2.fValue + 0x18);
      memcpy(&local_378,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_348;
      actValue_00._0_8_ = local_350;
      actValue_00.fValue._8_8_ = local_340;
      actValue_00.fValue._16_8_ = uStack_338;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_330;
      expValue_00.fValue.f_long = uStack_370;
      expValue_00._0_8_ = local_378;
      expValue_00.fValue._8_8_ = local_368;
      expValue_00.fValue._16_8_ = uStack_360;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_358;
      bVar2 = compareActualValue(dt_short,actValue_00,expValue_00);
      pXVar5 = local_318;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_318 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_318);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_2._4_4_ = 0;
    StrX::StrX(&local_3a8,lex_v_ran_iv_1);
    pXVar3 = StrX::unicodeForm(&local_3a8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_short,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3a8);
    local_398 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX((StrX *)local_408,pXVar3);
      StrX::localForm((StrX *)local_408);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x84c,lex_v_ran_iv_1);
      StrX::~StrX((StrX *)local_408);
      errSeen = true;
    }
    else {
      memcpy(&local_3d0,pXVar5,0x28);
      pcVar4 = lex_v_ran_v_1_canrep;
      memcpy(&local_3f8,pcVar4,0x28);
      actValue_01.fValue.f_long = uStack_3c8;
      actValue_01._0_8_ = local_3d0;
      actValue_01.fValue._8_8_ = local_3c0;
      actValue_01.fValue._16_8_ = uStack_3b8;
      actValue_01.fValue.f_datetime.f_milisec = (double)local_3b0;
      expValue_01.fValue.f_long = uStack_3f0;
      expValue_01._0_8_ = local_3f8;
      expValue_01.fValue._8_8_ = local_3e8;
      expValue_01.fValue._16_8_ = uStack_3e0;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_3d8;
      bVar2 = compareActualValue(dt_short,actValue_01,expValue_01);
      pXVar5 = local_398;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_398 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_398);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pcVar4);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_428,lex_v_ran_iv_2);
    pXVar3 = StrX::unicodeForm(&local_428);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_short,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_428);
    local_418 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_3._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_short);
        StrX::StrX((StrX *)local_448,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_448);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_3._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x84d,lex_v_ran_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_448);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX(&local_438,pXVar3);
      StrX::localForm(&local_438);
      pvVar10 = (void *)0x84d;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x84d,lex_v_ran_iv_2);
      StrX::~StrX(&local_438);
      pXVar5 = local_418;
      errSeen = true;
      if (local_418 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_418);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_468,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_468);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_short,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_468);
    local_458 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_short);
        StrX::StrX((StrX *)local_488,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_488);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_4._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x84e,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_488);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX(&local_478,pXVar3);
      StrX::localForm(&local_478);
      pvVar10 = (void *)0x84e;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x84e,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18));
      StrX::~StrX(&local_478);
      pXVar5 = local_458;
      errSeen = true;
      if (local_458 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_458);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_4a8,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_4a8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_short,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4a8);
    local_498 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_short);
        StrX::StrX((StrX *)local_4c8,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_4c8);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_5._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x850,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_4c8);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX(&local_4b8,pXVar3);
      StrX::localForm(&local_4b8);
      pvVar10 = (void *)0x850;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x850,lex_iv_2);
      StrX::~StrX(&local_4b8);
      pXVar5 = local_498;
      errSeen = true;
      if (local_498 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_498);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_6._4_4_ = st_Init;
    StrX::StrX(&local_4e8,data_rawstr_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_4e8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_short,(Status *)((long)&actRetValue_6 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_4e8);
    local_4d8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_6._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_short);
        StrX::StrX((StrX *)&myStatus_14,pXVar3);
        pcVar4 = StrX::localForm((StrX *)&myStatus_14);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_6._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x851,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)&myStatus_14);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX(&local_4f8,pXVar3);
      StrX::localForm(&local_4f8);
      pvVar10 = (void *)0x851;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x851,data_rawstr_1 + 8);
      StrX::~StrX(&local_4f8);
      pXVar5 = local_4d8;
      errSeen = true;
      if (local_4d8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_4d8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar,data_canrep_1);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_short,(Status *)&actRetCanRep,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar);
    local_518 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX((StrX *)local_550,pXVar3);
      StrX::localForm((StrX *)local_550);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x86f,data_canrep_1);
      StrX::~StrX((StrX *)local_550);
      errSeen = true;
    }
    else {
      local_530 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_530,data_rawstr_2 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_short);
        StrX::StrX(&local_540,pXVar3);
        pcVar4 = StrX::localForm(&local_540);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x86f,data_canrep_1,pcVar4,local_530,data_rawstr_2 + 8);
        StrX::~StrX(&local_540);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_518);
      xercesc_4_0::XMLString::release(&local_530,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_1._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_1,data_canrep_2);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_1);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_short,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_1);
    local_560 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX((StrX *)local_598,pXVar3);
      StrX::localForm((StrX *)local_598);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x870,data_canrep_2);
      StrX::~StrX((StrX *)local_598);
      errSeen = true;
    }
    else {
      local_578 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_578,acStack_120);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_short);
        StrX::StrX(&local_588,pXVar3);
        pcVar4 = StrX::localForm(&local_588);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x870,data_canrep_2,pcVar4,local_578,acStack_120);
        StrX::~StrX(&local_588);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_560);
      xercesc_4_0::XMLString::release(&local_578,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_2._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_2,lex_v_ran_v_2);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_2);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_short,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_2);
    local_5a8 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX((StrX *)local_5e0,pXVar3);
      StrX::localForm((StrX *)local_5e0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x872,lex_v_ran_v_2);
      StrX::~StrX((StrX *)local_5e0);
      errSeen = true;
    }
    else {
      local_5c0 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_5c0,lex_v_ran_v_2_canrep);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_short);
        StrX::StrX(&local_5d0,pXVar3);
        pcVar4 = StrX::localForm(&local_5d0);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x872,lex_v_ran_v_2,pcVar4,local_5c0,lex_v_ran_v_2_canrep);
        StrX::~StrX(&local_5d0);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_5a8);
      xercesc_4_0::XMLString::release(&local_5c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_3._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_3,lex_v_ran_iv_1);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_3);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_short,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_3);
    local_5f0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX((StrX *)local_628,pXVar3);
      StrX::localForm((StrX *)local_628);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x873,lex_v_ran_iv_1);
      StrX::~StrX((StrX *)local_628);
      errSeen = true;
    }
    else {
      local_608 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_608,lex_v_ran_iv_1_canrep);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_short);
        StrX::StrX(&local_618,pXVar3);
        pcVar4 = StrX::localForm(&local_618);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x873,lex_v_ran_iv_1,pcVar4,local_608,lex_v_ran_iv_1_canrep);
        StrX::~StrX(&local_618);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_5f0);
      xercesc_4_0::XMLString::release(&local_608,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_648,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_648);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_short,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_648);
    local_638 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_short);
        StrX::StrX((StrX *)local_668,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_668);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x875,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_668);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX(&local_658,pXVar3);
      StrX::localForm(&local_658);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x875,lex_iv_2);
      StrX::~StrX(&local_658);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_638);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_688,data_rawstr_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_688);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_short,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_688);
    local_678 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_short);
        StrX::StrX((StrX *)local_6a8,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_6a8);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x876,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_6a8);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX(&local_698,pXVar3);
      StrX::localForm(&local_698);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x876,data_rawstr_1 + 8);
      StrX::~StrX(&local_698);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_678);
      errSeen = true;
    }
  }
  actRetCanRep_6._4_4_ = st_Init;
  StrX::StrX(&local_6c8,lex_v_ran_iv_2);
  pXVar3 = StrX::unicodeForm(&local_6c8);
  lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (pXVar3,dt_short,(Status *)((long)&actRetCanRep_6 + 4),ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_6c8);
  local_6b8 = lVar9;
  if (lVar9 == 0) {
    if (actRetCanRep_6._4_4_ != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX((StrX *)local_6e8,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_6e8);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(actRetCanRep_6._4_4_);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x87b,lex_v_ran_iv_2,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_6e8);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_short);
    StrX::StrX(&local_6d8,pXVar3);
    StrX::localForm(&local_6d8);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x87b,lex_v_ran_iv_2);
    StrX::~StrX(&local_6d8);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_6b8);
    errSeen = true;
  }
  actRetCanRep_7._4_4_ = st_Init;
  StrX::StrX(&local_708,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_708);
  lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (pXVar3,dt_short,(Status *)((long)&actRetCanRep_7 + 4),ver_10,true,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_708);
  local_6f8 = lVar9;
  if (lVar9 == 0) {
    if (actRetCanRep_7._4_4_ != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX((StrX *)local_728,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_728);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(actRetCanRep_7._4_4_);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x87c,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_728);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_short);
    StrX::StrX(&local_718,pXVar3);
    pcVar4 = StrX::localForm(&local_718);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x87c,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4);
    StrX::~StrX(&local_718);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_6f8);
    errSeen = true;
  }
  actRetCanRep_8._4_4_ = 0;
  StrX::StrX((StrX *)&actRetCanRep_inchar_4,lex_v_ran_iv_2);
  pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_4);
  pwVar8 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (pXVar3,dt_short,(Status *)((long)&actRetCanRep_8 + 4),ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX((StrX *)&actRetCanRep_inchar_4);
  local_738 = pwVar8;
  if (pwVar8 == (wchar16 *)0x0) {
    pXVar3 = getDataTypeString(dt_short);
    StrX::StrX((StrX *)local_770,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_770);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x87f,lex_v_ran_iv_2,pcVar4);
    StrX::~StrX((StrX *)local_770);
    errSeen = true;
  }
  else {
    local_750 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar11 = xercesc_4_0::XMLString::equals(local_750,lex_v_ran_iv_2_canrep);
    if (!bVar11) {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX(&local_760,pXVar3);
      pcVar4 = StrX::localForm(&local_760);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x87f,lex_v_ran_iv_2,pcVar4,local_750,lex_v_ran_iv_2_canrep);
      StrX::~StrX(&local_760);
      errSeen = true;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_738);
    xercesc_4_0::XMLString::release(&local_750,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  actRetCanRep_9._4_4_ = 0;
  StrX::StrX((StrX *)&actRetCanRep_inchar_5,(char *)((long)&act_v_ran_v_0.fValue + 0x18));
  pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_5);
  pwVar8 = (wchar16 *)
           xercesc_4_0::XSValue::getCanonicalRepresentation
                     (pXVar3,dt_short,(Status *)((long)&actRetCanRep_9 + 4),ver_10,false,
                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX((StrX *)&actRetCanRep_inchar_5);
  local_780 = pwVar8;
  if (pwVar8 == (wchar16 *)0x0) {
    pXVar3 = getDataTypeString(dt_short);
    StrX::StrX(&local_7b8,pXVar3);
    pcVar4 = StrX::localForm(&local_7b8);
    printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x880,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4);
    StrX::~StrX(&local_7b8);
    errSeen = true;
  }
  else {
    local_798 = (char *)xercesc_4_0::XMLString::transcode
                                  (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar11 = xercesc_4_0::XMLString::equals(local_798,lex_iv_1 + 8);
    if (!bVar11) {
      pXVar3 = getDataTypeString(dt_short);
      StrX::StrX(&local_7a8,pXVar3);
      pcVar4 = StrX::localForm(&local_7a8);
      printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
             ,0x880,(undefined1 *)((long)&act_v_ran_v_0.fValue + 0x18),pcVar4,local_798,lex_iv_1 + 8
            );
      StrX::~StrX(&local_7a8);
      errSeen = true;
    }
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_780);
    xercesc_4_0::XMLString::release(&local_798,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  }
  return;
}

Assistant:

void test_dt_short()
{
    const XSValue::DataType dt = XSValue::dt_short;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="    1234    \n";

    const char lex_v_ran_v_1[]="+32767";
    const char lex_v_ran_v_2[]="-32768";
    const char lex_v_ran_iv_1[]="+32768";
    const char lex_v_ran_iv_2[]="-32769";

    XSValue::XSValue_Data act_v_ran_v_0;   act_v_ran_v_0.fValue.f_short = (short)1234;
    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_short = (short)+32767;
    XSValue::XSValue_Data act_v_ran_v_2;   act_v_ran_v_2.fValue.f_short = (short)-32768;

    const char lex_v_ran_v_1_canrep[]="32767";
    const char lex_v_ran_v_2_canrep[]="-32768";
    const char lex_v_ran_iv_1_canrep[]="32768";
    const char lex_v_ran_iv_2_canrep[]="-32769";

    const char lex_iv_1[]="1234.456";
    const char lex_iv_2[]="1234b56";

/***
 *
 * 3.3.18.2 Canonical representation
 *
 * The canonical representation for short is defined by prohibiting certain options from the
 * Lexical representation (3.3.18.1). Specifically,
 * 1. the the optional "+" sign is prohibited and
 * 2. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +12345   \n";
    const char data_canrep_1[]="12345";
    const char data_rawstr_2[]="00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, valid range
    VALIDATE_TEST(lex_v_ran_v_0  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, invalid range
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_0);

        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid                            XMLCh         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,        DONT_CARE);
        CANREP_TEST(data_rawstr_2, dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,        XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran_v_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_ran_v_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_v_2_canrep, DONT_CARE);

        CANREP_TEST(lex_iv_1,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,      dt, toValidate, EXP_RET_CANREP_FALSE, null_string,          XSValue::st_FOCA0002);

    }

    //validation on
    CANREP_TEST(lex_v_ran_iv_1, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
    CANREP_TEST(lex_v_ran_iv_2, dt, true,  EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    //validation off
    CANREP_TEST(lex_v_ran_iv_1, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep, DONT_CARE);
    CANREP_TEST(lex_v_ran_iv_2, dt, false, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep, DONT_CARE);
}